

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O0

vec2 vec2_isometric_projection(vec2 v,float scale,float angle)

{
  vec2 vVar1;
  float angle_local;
  float scale_local;
  vec2 v_local;
  vec2 vp;
  
  vVar1 = vec2_rotate(v,angle);
  v_local.y = vVar1.y;
  v_local.x = vVar1.x;
  v_local.y = v_local.y * scale;
  return v_local;
}

Assistant:

vec2 vec2_isometric_projection(vec2 v, float scale, float angle) {
    vec2 vp;

    vp = vec2_rotate(v, angle);
    vp.y *= scale;

    return vp;
}